

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  bool result;
  CodedInputStream *pCStack_10;
  Limit limit_local;
  CodedInputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = limit;
  pCStack_10 = this;
  absl_log_internal_check_op_result._3_1_ = ConsumedEntireMessage(this);
  PopLimit(this,absl_log_internal_check_op_result._4_4_);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(this->recursion_budget_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(this->recursion_limit_);
  local_20 = absl::lts_20250127::log_internal::Check_LTImpl
                       (v1,v2,"recursion_budget_ < recursion_limit_");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x9f,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  this->recursion_budget_ = this->recursion_budget_ + 1;
  return (bool)(absl_log_internal_check_op_result._3_1_ & 1);
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  ABSL_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}